

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i *palVar1;
  __m256i *palVar2;
  undefined8 *puVar3;
  undefined1 (*pauVar4) [32];
  __m256i alVar5;
  __m256i alVar6;
  undefined1 auVar7 [32];
  uint uVar8;
  void *pvVar9;
  parasail_matrix_t *ppVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256i alVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [24];
  int iVar28;
  uint uVar29;
  parasail_result_t *ppVar30;
  __m256i *b_13;
  __m256i *b_14;
  __m256i *b_15;
  __m256i *b_16;
  __m256i *ptr;
  __m256i *b_17;
  __m256i *b_18;
  __m256i *b_19;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int64_t *ptr_06;
  long lVar31;
  __m256i *palVar32;
  __m256i *palVar33;
  __m256i *palVar34;
  undefined8 uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  __m256i *palVar41;
  __m256i *palVar42;
  longlong lVar43;
  char *pcVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  longlong lVar48;
  uint uVar49;
  __m256i *size;
  __m256i *palVar50;
  char *__format;
  long lVar51;
  long lVar52;
  __m256i *__return_storage_ptr__;
  int iVar53;
  long lVar54;
  ulong uVar55;
  uint uVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar67 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar70 [32];
  __m256i alVar71;
  undefined1 auVar72 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 in_ZMM6 [64];
  __m256i_64_t h;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  int iVar80;
  ulong uVar81;
  undefined4 in_stack_fffffffffffff990;
  __m256i *palVar82;
  __m256i *palVar83;
  __m256i *palVar84;
  __m256i *palVar85;
  undefined4 in_stack_fffffffffffff9b8;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  int local_490;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar44 = "profile";
  }
  else {
    pvVar9 = (profile->profile64).score;
    if (pvVar9 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar44 = "profile->profile64.score";
    }
    else {
      ppVar10 = profile->matrix;
      if (ppVar10 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar44 = "profile->matrix";
      }
      else {
        uVar8 = profile->s1Len;
        if ((int)uVar8 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar44 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar44 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar44 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar44 = "open";
        }
        else {
          if (-1 < gap) {
            uVar56 = uVar8 - 1;
            uVar81 = (ulong)uVar8 + 3;
            size = (__m256i *)(uVar81 >> 2);
            uVar40 = (ulong)uVar56;
            uVar55 = uVar40 % (ulong)size;
            uVar38 = CONCAT44(0,open);
            iVar53 = -open;
            iVar46 = ppVar10->min;
            pvVar11 = (profile->profile64).matches;
            pvVar12 = (profile->profile64).similar;
            uVar39 = 0x8000000000000000 - (long)iVar46;
            if (iVar46 != iVar53 && SBORROW4(iVar46,iVar53) == iVar46 + open < 0) {
              uVar39 = uVar38 | 0x8000000000000000;
            }
            iVar46 = ppVar10->max;
            ppVar30 = parasail_result_new_stats();
            if (ppVar30 != (parasail_result_t *)0x0) {
              local_440._0_8_ = uVar81;
              local_420._0_4_ = (int)uVar55;
              ppVar30->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar30->flag | 0x4810402;
              b_13 = parasail_memalign___m256i(0x20,(size_t)size);
              b_14 = parasail_memalign___m256i(0x20,(size_t)size);
              b_15 = parasail_memalign___m256i(0x20,(size_t)size);
              b_16 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr = parasail_memalign___m256i(0x20,(size_t)size);
              b_17 = parasail_memalign___m256i(0x20,(size_t)size);
              b_18 = parasail_memalign___m256i(0x20,(size_t)size);
              b_19 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr_00 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr_01 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr_02 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr_03 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr_04 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr_05 = parasail_memalign___m256i(0x20,(size_t)size);
              ptr_06 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              auVar69._8_8_ = 0;
              auVar69._0_8_ = b_13;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = b_14;
              auVar69 = vpunpcklqdq_avx(auVar69,auVar73);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = b_15;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = b_16;
              auVar73 = vpunpcklqdq_avx(auVar58,auVar67);
              auVar58 = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar69;
              auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = ptr;
              auVar74._8_8_ = 0;
              auVar74._0_8_ = b_17;
              auVar69 = vpunpcklqdq_avx(auVar68,auVar74);
              auVar75._8_8_ = 0;
              auVar75._0_8_ = b_18;
              auVar77._8_8_ = 0;
              auVar77._0_8_ = b_19;
              auVar73 = vpunpcklqdq_avx(auVar75,auVar77);
              auVar69 = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar69;
              auVar73 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73;
              auVar76 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar60._0_8_ = -(ulong)(auVar58._0_8_ == 0);
              auVar60._8_8_ = -(ulong)(auVar58._8_8_ == 0);
              auVar60._16_8_ = -(ulong)(auVar67._0_8_ == 0);
              auVar60._24_8_ = -(ulong)(auVar67._8_8_ == 0);
              auVar70._0_8_ = -(ulong)(auVar69._0_8_ == 0);
              auVar70._8_8_ = -(ulong)(auVar69._8_8_ == 0);
              auVar70._16_8_ = -(ulong)(auVar73._0_8_ == 0);
              auVar70._24_8_ = -(ulong)(auVar73._8_8_ == 0);
              auVar60 = vpackssdw_avx2(auVar60,auVar70);
              if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                    ptr_05 != (__m256i *)0x0) &&
                   ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                   ptr_02 != (__m256i *)0x0)) && ptr_06 != (int64_t *)0x0) &&
                  ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar60 >> 0x7f,0) == '\0') &&
                     (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar60 >> 0xbf,0) == '\0') &&
                   (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar60[0x1f])) {
                iVar28 = s2Len + -1;
                iVar37 = -(int)(uVar40 / (ulong)size);
                iVar45 = iVar37 + 3;
                uVar40 = CONCAT44(0,gap);
                auVar59._8_4_ = gap;
                auVar59._0_8_ = uVar40;
                auVar59._12_4_ = 0;
                auVar59._16_4_ = gap;
                auVar59._20_4_ = 0;
                auVar59._24_4_ = gap;
                auVar59._28_4_ = 0;
                uVar39 = uVar39 + 1;
                lVar51 = 0x7ffffffffffffffe - (long)iVar46;
                auVar65._8_8_ = uVar81;
                auVar65._0_8_ = uVar81;
                auVar65._16_8_ = uVar81;
                auVar65._24_8_ = uVar81;
                auVar60 = vpsrlq_avx2(auVar65,2);
                auVar65 = vpblendd_avx2(auVar60,ZEXT1632((undefined1  [16])0x0),3);
                uVar49 = (uint)size;
                lVar31 = (long)(int)-(uVar49 * gap);
                auVar61._8_8_ = lVar31;
                auVar61._0_8_ = lVar31;
                auVar61._16_8_ = lVar31;
                auVar61._24_8_ = lVar31;
                auVar60 = vpblendd_avx2(auVar61,ZEXT1632((undefined1  [16])0x0),3);
                auVar60 = vpaddq_avx2(ZEXT832(uVar39),auVar60);
                alVar18[0]._4_4_ = in_stack_fffffffffffff984;
                alVar18[0]._0_4_ = in_stack_fffffffffffff980;
                alVar18[1] = uVar39;
                alVar18[2]._0_4_ = in_stack_fffffffffffff990;
                alVar18[2]._4_4_ = iVar28;
                alVar18[3] = (longlong)b_19;
                uVar81 = uVar39;
                parasail_memset___m256i(b_17,alVar18,(size_t)size);
                alVar5[0]._4_4_ = in_stack_fffffffffffff984;
                alVar5[0]._0_4_ = in_stack_fffffffffffff980;
                alVar5[1] = uVar81;
                alVar5[2]._0_4_ = in_stack_fffffffffffff990;
                alVar5[2]._4_4_ = iVar28;
                alVar5[3] = (longlong)b_19;
                parasail_memset___m256i(b_18,alVar5,(size_t)size);
                alVar6[0]._4_4_ = in_stack_fffffffffffff984;
                alVar6[0]._0_4_ = in_stack_fffffffffffff980;
                alVar6[1] = uVar81;
                alVar6[2]._0_4_ = in_stack_fffffffffffff990;
                alVar6[2]._4_4_ = iVar28;
                alVar6[3] = (longlong)b_19;
                parasail_memset___m256i(b_19,alVar6,(size_t)size);
                c[0]._4_4_ = in_stack_fffffffffffff984;
                c[0]._0_4_ = in_stack_fffffffffffff980;
                c[1] = uVar81;
                c[2]._0_4_ = in_stack_fffffffffffff990;
                c[2]._4_4_ = iVar28;
                c[3] = (longlong)b_19;
                parasail_memset___m256i(b_13,c,(size_t)size);
                c_00[0]._4_4_ = in_stack_fffffffffffff984;
                c_00[0]._0_4_ = in_stack_fffffffffffff980;
                c_00[1] = uVar81;
                c_00[2]._0_4_ = in_stack_fffffffffffff990;
                c_00[2]._4_4_ = iVar28;
                c_00[3] = (longlong)b_19;
                parasail_memset___m256i(b_14,c_00,(size_t)size);
                c_01[0]._4_4_ = in_stack_fffffffffffff984;
                c_01[0]._0_4_ = in_stack_fffffffffffff980;
                c_01[1] = uVar81;
                c_01[2]._0_4_ = in_stack_fffffffffffff990;
                c_01[2]._4_4_ = iVar28;
                c_01[3] = (longlong)b_19;
                parasail_memset___m256i(b_15,c_01,(size_t)size);
                c_02[0]._4_4_ = in_stack_fffffffffffff984;
                c_02[0]._0_4_ = in_stack_fffffffffffff980;
                c_02[1] = uVar81;
                c_02[2]._0_4_ = in_stack_fffffffffffff990;
                c_02[2]._4_4_ = iVar28;
                c_02[3] = (longlong)b_19;
                parasail_memset___m256i(b_16,c_02,(size_t)size);
                auVar79._8_4_ = open;
                auVar79._0_8_ = uVar38;
                auVar79._12_4_ = 0;
                auVar79._16_4_ = open;
                auVar79._20_4_ = 0;
                auVar79._24_4_ = open;
                auVar79._28_4_ = 0;
                alVar18 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar79);
                uVar29 = uVar49 - 1;
                alVar71[1] = 1;
                alVar71[0] = 1;
                alVar71[2] = 1;
                alVar71[3] = 1;
                auVar70 = vpcmpeqd_avx2(auVar76,auVar76);
                for (uVar36 = uVar29; -1 < (int)uVar36; uVar36 = uVar36 - 1) {
                  ptr_04[uVar36] = alVar18;
                  ptr_05[uVar36] = alVar71;
                  alVar18 = (__m256i)vpsubq_avx2((undefined1  [32])alVar18,auVar59);
                  alVar71 = (__m256i)vpsubq_avx2((undefined1  [32])alVar71,auVar70);
                }
                lVar31 = (long)iVar53;
                for (palVar50 = (__m256i *)0x0; palVar50 != size;
                    palVar50 = (__m256i *)((long)*palVar50 + 1)) {
                  lVar52 = lVar31;
                  for (lVar54 = 0; lVar54 != 4; lVar54 = lVar54 + 1) {
                    lVar43 = lVar52;
                    if (s1_beg != 0) {
                      lVar43 = 0;
                    }
                    local_80[lVar54] = lVar43;
                    lVar52 = lVar52 - (long)size * uVar40;
                  }
                  palVar1 = ptr + (long)palVar50;
                  (*palVar1)[0] = local_80[0];
                  (*palVar1)[1] = local_80[1];
                  (*palVar1)[2] = local_80[2];
                  (*palVar1)[3] = local_80[3];
                  lVar31 = lVar31 - uVar40;
                }
                *ptr_06 = 0;
                for (uVar40 = 1; s2Len + 1 != uVar40; uVar40 = uVar40 + 1) {
                  iVar46 = 0;
                  if (s2_beg == 0) {
                    iVar46 = iVar53;
                  }
                  ptr_06[uVar40] = (long)iVar46;
                  iVar53 = iVar53 - gap;
                }
                palVar50 = ptr + uVar29;
                palVar1 = b_17 + uVar29;
                palVar2 = b_18 + uVar29;
                palVar41 = b_19 + uVar29;
                palVar32 = ptr + uVar55;
                palVar33 = b_17 + uVar55;
                palVar34 = b_18 + uVar55;
                palVar42 = b_19 + uVar55;
                local_220._8_8_ = lVar51;
                local_220._0_8_ = lVar51;
                local_220._16_8_ = lVar51;
                local_220._24_8_ = lVar51;
                auVar14._8_8_ = uVar39;
                auVar14._0_8_ = uVar39;
                auVar14._16_8_ = uVar39;
                auVar14._24_8_ = uVar39;
                auVar66 = ZEXT3264(auVar14);
                uVar40 = 0;
                auVar76 = auVar14;
                auVar70 = auVar14;
                iVar46 = iVar28;
                local_240 = auVar14;
                while (uVar40 != (uint)s2Len) {
                  auVar62 = auVar66._0_32_;
                  alVar18 = *palVar50;
                  alVar71 = *palVar1;
                  alVar5 = *palVar2;
                  alVar6 = *palVar41;
                  auVar69 = alVar18._0_16_;
                  auVar78._0_16_ = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar69;
                  auVar78._16_16_ = ZEXT116(0) * alVar18._16_16_ + ZEXT116(1) * auVar69;
                  auVar79 = vpalignr_avx2((undefined1  [32])alVar18,auVar78,8);
                  auVar61 = vperm2i128_avx2((undefined1  [32])alVar71,(undefined1  [32])alVar71,8);
                  auVar61 = vpalignr_avx2((undefined1  [32])alVar71,auVar61,8);
                  auVar78 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                  auVar78 = vpalignr_avx2((undefined1  [32])alVar5,auVar78,8);
                  auVar21 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                  auVar21 = vpalignr_avx2((undefined1  [32])alVar6,auVar21,8);
                  auVar20 = vpblendd_avx2(auVar79,ZEXT832((ulong)ptr_06[uVar40]),3);
                  lVar31 = (long)(int)(ppVar10->mapper[(byte)s2[uVar40]] * uVar49) * 0x20;
                  local_460._8_8_ = uVar39;
                  local_460._0_8_ = uVar39;
                  local_460._16_8_ = uVar39;
                  local_460._24_8_ = uVar39;
                  auVar79 = vpsubq_avx2(local_460,(undefined1  [32])*ptr_04);
                  auVar66 = ZEXT3264(auVar79);
                  local_520 = ZEXT1632(ZEXT816(0));
                  lVar52 = 0;
                  local_580 = ZEXT1632(ZEXT816(0));
                  local_480 = ZEXT1632(ZEXT816(0));
                  __return_storage_ptr__ = size;
                  while( true ) {
                    auVar79 = in_ZMM6._0_32_;
                    if ((long)size << 5 == lVar52) break;
                    auVar7 = *(undefined1 (*) [32])((long)*ptr + lVar52);
                    auVar72 = *(undefined1 (*) [32])((long)*b_17 + lVar52);
                    auVar22 = *(undefined1 (*) [32])((long)*b_18 + lVar52);
                    auVar23 = *(undefined1 (*) [32])((long)*b_19 + lVar52);
                    auVar24 = *(undefined1 (*) [32])((long)*b_14 + lVar52);
                    auVar25 = *(undefined1 (*) [32])((long)*b_15 + lVar52);
                    auVar26 = *(undefined1 (*) [32])((long)*b_16 + lVar52);
                    auVar19._8_4_ = open;
                    auVar19._0_8_ = uVar38;
                    auVar19._12_4_ = 0;
                    auVar19._16_4_ = open;
                    auVar19._20_4_ = 0;
                    auVar19._24_4_ = open;
                    auVar19._28_4_ = 0;
                    auVar64 = vpsubq_avx2(auVar7,auVar19);
                    auVar19 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b_13 + lVar52),auVar59);
                    auVar17 = vpcmpgtq_avx2(auVar64,auVar19);
                    auVar19 = vpaddq_avx2(auVar66._0_32_,
                                          *(undefined1 (*) [32])((long)*ptr_04 + lVar52));
                    auVar63 = vpaddq_avx2(auVar79,*(undefined1 (*) [32])((long)*ptr_05 + lVar52));
                    auVar20 = vpaddq_avx2(auVar20,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar52 + lVar31));
                    auVar15 = vpaddq_avx2(auVar61,*(undefined1 (*) [32])
                                                   ((long)pvVar11 + lVar52 + lVar31));
                    auVar16 = vpaddq_avx2(auVar78,*(undefined1 (*) [32])
                                                   ((long)pvVar12 + lVar52 + lVar31));
                    a[0]._4_4_ = iVar28;
                    a[0]._0_4_ = in_stack_fffffffffffff980;
                    a[1] = uVar81;
                    a[2]._0_4_ = in_stack_fffffffffffff990;
                    a[2]._4_4_ = iVar46;
                    a[3] = (longlong)b_19;
                    b[1] = (longlong)b_17;
                    b[0] = (longlong)b_18;
                    b[2] = (longlong)ptr;
                    b[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b);
                    auVar79 = vblendvpd_avx(auVar24,auVar72,auVar17);
                    auVar61 = vblendvpd_avx(auVar25,auVar22,auVar17);
                    auVar78 = vblendvpd_avx(auVar26,auVar23,auVar17);
                    auVar17 = vpcmpeqd_avx2(auVar17,auVar17);
                    auVar17 = vpsubq_avx2(auVar78,auVar17);
                    auVar78 = vpcmpgtq_avx2(auVar19,local_460);
                    a_00[0]._4_4_ = iVar28;
                    a_00[0]._0_4_ = in_stack_fffffffffffff980;
                    a_00[1] = uVar81;
                    a_00[2]._0_4_ = in_stack_fffffffffffff990;
                    a_00[2]._4_4_ = iVar46;
                    a_00[3] = (longlong)b_19;
                    b_00[1] = (longlong)b_17;
                    b_00[0] = (longlong)b_18;
                    b_00[2] = (longlong)ptr;
                    b_00[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_00[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_00);
                    local_520 = vblendvpd_avx(local_520,local_420,auVar78);
                    local_580 = vblendvpd_avx(local_580,local_440,auVar78);
                    local_480 = vblendvpd_avx(local_480,auVar63,auVar78);
                    auVar21 = vpsubq_avx2(auVar21,_DAT_008a5a80);
                    auVar66 = ZEXT3264(auVar64);
                    auVar78 = vpcmpgtq_avx2(auVar64,auVar20);
                    a_01[0]._4_4_ = iVar28;
                    a_01[0]._0_4_ = in_stack_fffffffffffff980;
                    a_01[1] = uVar81;
                    a_01[2]._0_4_ = in_stack_fffffffffffff990;
                    a_01[2]._4_4_ = iVar46;
                    a_01[3] = (longlong)b_19;
                    b_01[1] = (longlong)b_17;
                    b_01[0] = (longlong)b_18;
                    b_01[2] = (longlong)ptr;
                    b_01[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_01[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
                    local_420 = vblendvpd_avx(auVar15,auVar79,auVar78);
                    local_440 = vblendvpd_avx(auVar16,auVar61,auVar78);
                    auVar78 = vblendvpd_avx(auVar21,auVar17,auVar78);
                    in_ZMM6 = ZEXT3264(auVar78);
                    local_540._0_8_ = auVar64._0_8_;
                    local_540._8_8_ = auVar64._8_8_;
                    local_540._16_8_ = auVar64._16_8_;
                    local_540._24_8_ = auVar64._24_8_;
                    puVar3 = (undefined8 *)((long)*b_13 + lVar52);
                    *puVar3 = local_540._0_8_;
                    puVar3[1] = local_540._8_8_;
                    puVar3[2] = local_540._16_8_;
                    puVar3[3] = local_540._24_8_;
                    *(undefined1 (*) [32])((long)*b_14 + lVar52) = auVar79;
                    *(undefined1 (*) [32])((long)*b_15 + lVar52) = auVar61;
                    *(undefined1 (*) [32])((long)*b_16 + lVar52) = auVar17;
                    local_600._0_8_ = auVar20._0_8_;
                    local_600._8_8_ = auVar20._8_8_;
                    local_600._16_8_ = auVar20._16_8_;
                    local_600._24_8_ = auVar20._24_8_;
                    puVar3 = (undefined8 *)((long)*ptr + lVar52);
                    *puVar3 = local_600._0_8_;
                    puVar3[1] = local_600._8_8_;
                    puVar3[2] = local_600._16_8_;
                    puVar3[3] = local_600._24_8_;
                    *(undefined1 (*) [32])((long)*b_17 + lVar52) = auVar15;
                    *(undefined1 (*) [32])((long)*b_18 + lVar52) = auVar16;
                    *(undefined1 (*) [32])((long)*b_19 + lVar52) = auVar21;
                    lVar52 = lVar52 + 0x20;
                    auVar61 = auVar72;
                    auVar78 = auVar22;
                    auVar20 = auVar7;
                    auVar21 = auVar23;
                  }
                  auVar78 = vpermq_avx2(auVar66._0_32_,0x90);
                  auVar61 = vperm2i128_avx2(local_420,local_420,8);
                  local_420 = vpalignr_avx2(local_420,auVar61,8);
                  auVar61 = vperm2i128_avx2(local_440,local_440,8);
                  local_440 = vpalignr_avx2(local_440,auVar61,8);
                  auVar61 = vperm2i128_avx2(auVar79,auVar79,8);
                  auVar21 = vpalignr_avx2(auVar79,auVar61,8);
                  auVar7 = vpblendd_avx2(auVar78,ZEXT832((ulong)ptr_06[uVar40 + 1]),3);
                  auVar79 = vpaddq_avx2(auVar7,(undefined1  [32])*ptr_04);
                  auVar66 = ZEXT3264(local_460);
                  auVar20 = vpcmpgtq_avx2(local_460,auVar79);
                  auVar79 = vpaddq_avx2(auVar21,(undefined1  [32])*ptr_05);
                  a_02[0]._4_4_ = iVar28;
                  a_02[0]._0_4_ = in_stack_fffffffffffff980;
                  a_02[1] = uVar81;
                  a_02[2]._0_4_ = in_stack_fffffffffffff990;
                  a_02[2]._4_4_ = iVar46;
                  a_02[3] = (longlong)b_19;
                  b_02[1] = (longlong)b_17;
                  b_02[0] = (longlong)b_18;
                  b_02[2] = (longlong)ptr;
                  b_02[3]._0_4_ = in_stack_fffffffffffff9b8;
                  b_02[3]._4_4_ = uVar56;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_02);
                  auVar78 = vblendvpd_avx(local_420,local_520,auVar20);
                  auVar61 = vblendvpd_avx(local_440,local_580,auVar20);
                  auVar79 = vblendvpd_avx(auVar79,local_480,auVar20);
                  iVar53 = 2;
                  while( true ) {
                    auVar63 = auVar66._0_32_;
                    auVar20 = vperm2i128_avx2(auVar63,auVar63,8);
                    auVar19 = vpalignr_avx2(auVar63,auVar20,8);
                    auVar20 = vperm2f128_avx(auVar78,auVar78,8);
                    local_5e0 = vpalignr_avx2(auVar78,auVar20,8);
                    auVar20 = vperm2f128_avx(auVar61,auVar61,8);
                    local_5a0 = vpalignr_avx2(auVar61,auVar20,8);
                    auVar20 = vperm2f128_avx(auVar79,auVar79,8);
                    local_560 = vpalignr_avx2(auVar79,auVar20,8);
                    bVar57 = iVar53 == 0;
                    iVar53 = iVar53 + -1;
                    if (bVar57) break;
                    auVar20 = vpaddq_avx2(auVar19,auVar60);
                    auVar19 = vpcmpgtq_avx2(auVar63,auVar20);
                    a_03[0]._4_4_ = iVar28;
                    a_03[0]._0_4_ = in_stack_fffffffffffff980;
                    a_03[1] = uVar81;
                    a_03[2]._0_4_ = in_stack_fffffffffffff990;
                    a_03[2]._4_4_ = iVar46;
                    a_03[3] = (longlong)b_19;
                    b_03[1] = (longlong)b_17;
                    b_03[0] = (longlong)b_18;
                    b_03[2] = (longlong)ptr;
                    b_03[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_03[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_03);
                    auVar78 = vblendvpd_avx(local_5e0,auVar78,auVar19);
                    auVar61 = vblendvpd_avx(local_5a0,auVar61,auVar19);
                    auVar20 = vpaddq_avx2(local_560,auVar65);
                    auVar79 = vblendvpd_avx(auVar20,auVar79,auVar19);
                  }
                  local_600 = vpaddq_avx2(auVar19,ZEXT832(uVar39));
                  auVar79 = vpcmpgtq_avx2(local_600,auVar7);
                  a_04[0]._4_4_ = iVar28;
                  a_04[0]._0_4_ = in_stack_fffffffffffff980;
                  a_04[1] = uVar81;
                  a_04[2]._0_4_ = in_stack_fffffffffffff990;
                  a_04[2]._4_4_ = iVar46;
                  a_04[3] = (longlong)b_19;
                  b_04[1] = (longlong)b_17;
                  b_04[0] = (longlong)b_18;
                  b_04[2] = (longlong)ptr;
                  b_04[3]._0_4_ = in_stack_fffffffffffff9b8;
                  b_04[3]._4_4_ = uVar56;
                  local_460 = local_600;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_04);
                  local_540 = vblendvpd_avx(local_420,local_5e0,auVar79);
                  local_520 = vblendvpd_avx(local_440,local_5a0,auVar79);
                  local_580 = vblendvpd_avx(auVar21,local_560,auVar79);
                  for (lVar31 = 0; (long)size << 5 != lVar31; lVar31 = lVar31 + 0x20) {
                    pauVar4 = (undefined1 (*) [32])((long)*ptr + lVar31);
                    auVar27 = *(undefined1 (*) [24])*pauVar4;
                    lVar52 = *(long *)(*pauVar4 + 0x18);
                    auVar78 = *pauVar4;
                    auVar7 = *(undefined1 (*) [32])((long)*b_17 + lVar31);
                    auVar19 = *(undefined1 (*) [32])((long)*b_18 + lVar31);
                    auVar63 = *(undefined1 (*) [32])((long)*b_19 + lVar31);
                    auVar15 = *(undefined1 (*) [32])((long)*b_14 + lVar31);
                    auVar16 = *(undefined1 (*) [32])((long)*b_15 + lVar31);
                    auVar17 = *(undefined1 (*) [32])((long)*b_16 + lVar31);
                    auVar20._8_4_ = open;
                    auVar20._0_8_ = uVar38;
                    auVar20._12_4_ = 0;
                    auVar20._16_4_ = open;
                    auVar20._20_4_ = 0;
                    auVar20._24_4_ = open;
                    auVar20._28_4_ = 0;
                    auVar79 = vpsubq_avx2(local_460,auVar20);
                    auVar61 = vpsubq_avx2(local_600,auVar59);
                    a_05[0]._4_4_ = iVar28;
                    a_05[0]._0_4_ = in_stack_fffffffffffff980;
                    a_05[1] = uVar81;
                    a_05[2]._0_4_ = in_stack_fffffffffffff990;
                    a_05[2]._4_4_ = iVar46;
                    a_05[3] = (longlong)b_19;
                    b_05[1] = (longlong)b_17;
                    b_05[0] = (longlong)b_18;
                    b_05[2] = (longlong)ptr;
                    b_05[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_05[3]._4_4_ = uVar56;
                    local_600 = auVar79;
                    palVar82 = b_19;
                    palVar83 = b_18;
                    palVar84 = b_17;
                    palVar85 = ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_05);
                    auVar79 = vpcmpgtq_avx2(auVar79,auVar61);
                    local_5e0 = vblendvpd_avx(local_5e0,local_540,auVar79);
                    local_5a0 = vblendvpd_avx(local_5a0,local_520,auVar79);
                    auVar79 = vblendvpd_avx(local_560,local_580,auVar79);
                    local_560 = vpsubq_avx2(auVar79,_DAT_008a5a80);
                    a_06[0]._4_4_ = iVar28;
                    a_06[0]._0_4_ = in_stack_fffffffffffff980;
                    a_06[1] = uVar81;
                    a_06[2]._0_4_ = in_stack_fffffffffffff990;
                    a_06[2]._4_4_ = iVar46;
                    a_06[3] = (longlong)palVar82;
                    b_06[1] = (longlong)palVar84;
                    b_06[0] = (longlong)palVar83;
                    b_06[2] = (longlong)palVar85;
                    b_06[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_06[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_06);
                    a_07[0]._4_4_ = iVar28;
                    a_07[0]._0_4_ = in_stack_fffffffffffff980;
                    a_07[1] = uVar81;
                    a_07[2]._0_4_ = in_stack_fffffffffffff990;
                    a_07[2]._4_4_ = iVar46;
                    a_07[3] = (longlong)palVar82;
                    b_07[1] = (longlong)palVar84;
                    b_07[0] = (longlong)palVar83;
                    b_07[2] = (longlong)palVar85;
                    b_07[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_07[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_07,b_07);
                    local_480._0_8_ = auVar27._0_8_;
                    auVar64._0_8_ = -(ulong)(auVar78._0_8_ == local_480._0_8_);
                    local_480._8_8_ = auVar27._8_8_;
                    auVar64._8_8_ = -(ulong)(auVar78._8_8_ == local_480._8_8_);
                    auVar64._16_8_ = -(ulong)(auVar78._16_8_ == auVar27._16_8_);
                    auVar64._24_8_ = -(ulong)(auVar78._24_8_ == lVar52);
                    auVar72._0_8_ = -(ulong)(auVar78._0_8_ == local_600._0_8_);
                    auVar72._8_8_ = -(ulong)(auVar78._8_8_ == local_600._8_8_);
                    auVar72._16_8_ = -(ulong)(auVar78._16_8_ == local_600._16_8_);
                    auVar72._24_8_ = -(ulong)(auVar78._24_8_ == local_600._24_8_);
                    auVar79 = vblendvpd_avx(auVar15,local_5e0,auVar72);
                    local_540 = vblendvpd_avx(auVar79,auVar7,auVar64);
                    auVar79 = vblendvpd_avx(auVar16,local_5a0,auVar72);
                    local_520 = vblendvpd_avx(auVar79,auVar19,auVar64);
                    auVar79 = vblendvpd_avx(auVar17,local_560,auVar72);
                    local_580 = vblendvpd_avx(auVar79,auVar63,auVar64);
                    *(undefined1 (*) [32])((long)*ptr + lVar31) = auVar78;
                    *(undefined1 (*) [32])((long)*b_17 + lVar31) = local_540;
                    *(undefined1 (*) [32])((long)*b_18 + lVar31) = local_520;
                    *(undefined1 (*) [32])((long)*b_19 + lVar31) = local_580;
                    auVar79 = vpcmpgtq_avx2(auVar78,local_220);
                    local_220 = vblendvpd_avx(auVar78,local_220,auVar79);
                    a_08[0]._4_4_ = iVar28;
                    a_08[0]._0_4_ = in_stack_fffffffffffff980;
                    a_08[1] = uVar81;
                    a_08[2]._0_4_ = in_stack_fffffffffffff990;
                    a_08[2]._4_4_ = iVar46;
                    a_08[3] = (longlong)palVar82;
                    b_08[1] = (longlong)palVar84;
                    b_08[0] = (longlong)palVar83;
                    b_08[2] = (longlong)palVar85;
                    b_08[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_08[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_08,b_08);
                    a_09[0]._4_4_ = iVar28;
                    a_09[0]._0_4_ = in_stack_fffffffffffff980;
                    a_09[1] = uVar81;
                    a_09[2]._0_4_ = in_stack_fffffffffffff990;
                    a_09[2]._4_4_ = iVar46;
                    a_09[3] = (longlong)palVar82;
                    b_09[1] = (longlong)palVar84;
                    b_09[0] = (longlong)palVar83;
                    b_09[2] = (longlong)palVar85;
                    b_09[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_09[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_09,b_09);
                    a_10[0]._4_4_ = iVar28;
                    a_10[0]._0_4_ = in_stack_fffffffffffff980;
                    a_10[1] = uVar81;
                    a_10[2]._0_4_ = in_stack_fffffffffffff990;
                    a_10[2]._4_4_ = iVar46;
                    a_10[3] = (longlong)palVar82;
                    b_10[1] = (longlong)palVar84;
                    b_10[0] = (longlong)palVar83;
                    b_10[2] = (longlong)palVar85;
                    b_10[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_10[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_10,b_10);
                    a_11[0]._4_4_ = iVar28;
                    a_11[0]._0_4_ = in_stack_fffffffffffff980;
                    a_11[1] = uVar81;
                    a_11[2]._0_4_ = in_stack_fffffffffffff990;
                    a_11[2]._4_4_ = iVar46;
                    a_11[3] = (longlong)palVar82;
                    b_11[1] = (longlong)palVar84;
                    b_11[0] = (longlong)palVar83;
                    b_11[2] = (longlong)palVar85;
                    b_11[3]._0_4_ = in_stack_fffffffffffff9b8;
                    b_11[3]._4_4_ = uVar56;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_11,b_11);
                    b_19 = palVar82;
                    b_18 = palVar83;
                    b_17 = palVar84;
                    ptr = palVar85;
                    local_460 = auVar78;
                  }
                  alVar18 = *palVar33;
                  alVar71 = *palVar34;
                  alVar5 = *palVar42;
                  auVar66 = ZEXT3264(auVar62);
                  auVar79 = vpcmpgtq_avx2((undefined1  [32])*palVar32,auVar62);
                  a_12[0]._4_4_ = iVar28;
                  a_12[0]._0_4_ = in_stack_fffffffffffff980;
                  a_12[1] = uVar81;
                  a_12[2]._0_4_ = in_stack_fffffffffffff990;
                  a_12[2]._4_4_ = iVar46;
                  a_12[3] = (longlong)b_19;
                  b_12[1] = (longlong)b_17;
                  b_12[0] = (longlong)b_18;
                  b_12[2] = (longlong)ptr;
                  b_12[3]._0_4_ = in_stack_fffffffffffff9b8;
                  b_12[3]._4_4_ = uVar56;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_12,b_12);
                  auVar70 = vblendvpd_avx(auVar70,(undefined1  [32])alVar18,auVar79);
                  auVar76 = vblendvpd_avx(auVar76,(undefined1  [32])alVar71,auVar79);
                  auVar14 = vblendvpd_avx(auVar14,(undefined1  [32])alVar5,auVar79);
                  auVar62._8_8_ = -(ulong)(iVar45 == 2);
                  auVar62._0_8_ = -(ulong)(iVar45 == 3);
                  auVar62._16_8_ = -(ulong)(iVar45 == 1);
                  auVar62._24_8_ = -(ulong)(iVar37 == -3);
                  auVar62 = auVar62 & auVar79;
                  local_490 = (int)uVar40;
                  if ((((auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar62 >> 0x7f,0) != '\0') || SUB321(auVar62 >> 0xbf,0) != '\0') ||
                      auVar62[0x1f] < '\0') {
                    iVar28 = local_490;
                  }
                  in_ZMM6 = ZEXT3264(auVar21);
                  uVar40 = uVar40 + 1;
                }
                uVar40 = 0;
                if (s2_end == 0) {
                  lVar43 = 0;
                  lVar48 = 0;
                }
                else {
                  for (; (int)uVar40 < iVar45; uVar40 = (ulong)((int)uVar40 + 1)) {
                    auVar65 = auVar66._0_32_;
                    auVar60 = vperm2i128_avx2(auVar65,auVar65,8);
                    auVar60 = vpalignr_avx2(auVar65,auVar60,8);
                    auVar66 = ZEXT3264(auVar60);
                    auVar60 = vperm2i128_avx2(auVar70,auVar70,8);
                    auVar70 = vpalignr_avx2(auVar70,auVar60,8);
                    auVar60 = vperm2i128_avx2(auVar76,auVar76,8);
                    auVar76 = vpalignr_avx2(auVar76,auVar60,8);
                    auVar60 = vperm2i128_avx2(auVar14,auVar14,8);
                    auVar14 = vpalignr_avx2(auVar14,auVar60,8);
                  }
                  uVar81 = vpextrq_avx(auVar66._16_16_,1);
                  uVar40 = vpextrq_avx(auVar70._16_16_,1);
                  lVar43 = vpextrq_avx(auVar76._16_16_,1);
                  lVar48 = vpextrq_avx(auVar14._16_16_,1);
                }
                iVar47 = (int)lVar48;
                iVar37 = (int)lVar43;
                iVar53 = (int)uVar40;
                uVar36 = uVar56;
                if (s1_end != 0) {
                  uVar55 = 0;
                  while( true ) {
                    iVar47 = (int)lVar48;
                    iVar37 = (int)lVar43;
                    iVar53 = (int)uVar40;
                    if ((uVar49 & 0x1fffffff) << 2 == (uint)uVar55) break;
                    uVar29 = ((uint)uVar55 & 3) * uVar49 + ((uint)(uVar55 >> 2) & 0x3fffffff);
                    uVar38 = uVar81;
                    if ((int)uVar29 < (int)uVar8) {
                      uVar13 = (*ptr)[uVar55];
                      uVar38 = uVar13;
                      if (((long)uVar81 < (long)uVar13) ||
                         (((uVar38 = uVar81, uVar13 == uVar81 && (iVar28 == iVar46)) &&
                          ((int)uVar29 < (int)uVar36)))) {
                        uVar40 = (*b_17)[uVar55];
                        lVar43 = (*b_18)[uVar55];
                        lVar48 = (*b_19)[uVar55];
                        uVar36 = uVar29;
                        iVar28 = iVar46;
                      }
                    }
                    uVar55 = uVar55 + 1;
                    uVar81 = uVar38;
                  }
                }
                iVar80 = (int)uVar81;
                if (s2_end == 0 && s1_end == 0) {
                  alVar18 = *palVar32;
                  alVar71 = *palVar33;
                  alVar5 = *palVar34;
                  alVar6 = *palVar42;
                  for (iVar53 = 0; iVar53 < iVar45; iVar53 = iVar53 + 1) {
                    auVar60 = vperm2i128_avx2((undefined1  [32])alVar18,(undefined1  [32])alVar18,8)
                    ;
                    alVar18 = (__m256i)vpalignr_avx2((undefined1  [32])alVar18,auVar60,8);
                    auVar60 = vperm2i128_avx2((undefined1  [32])alVar71,(undefined1  [32])alVar71,8)
                    ;
                    alVar71 = (__m256i)vpalignr_avx2((undefined1  [32])alVar71,auVar60,8);
                    auVar60 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                    alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar60,8);
                    auVar60 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                    alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar60,8);
                  }
                  uVar35 = vpextrq_avx(alVar18._16_16_,1);
                  iVar80 = (int)uVar35;
                  uVar35 = vpextrq_avx(alVar71._16_16_,1);
                  iVar53 = (int)uVar35;
                  uVar35 = vpextrq_avx(alVar5._16_16_,1);
                  iVar37 = (int)uVar35;
                  uVar35 = vpextrq_avx(alVar6._16_16_,1);
                  iVar47 = (int)uVar35;
                  uVar36 = uVar56;
                  iVar28 = iVar46;
                }
                auVar76._8_8_ = uVar39;
                auVar76._0_8_ = uVar39;
                auVar76._16_8_ = uVar39;
                auVar76._24_8_ = uVar39;
                auVar60 = vpcmpgtq_avx2(auVar76,local_220);
                auVar21._8_8_ = lVar51;
                auVar21._0_8_ = lVar51;
                auVar21._16_8_ = lVar51;
                auVar21._24_8_ = lVar51;
                auVar70 = vpcmpgtq_avx2(local_240,auVar21);
                auVar60 = vpor_avx2(auVar70,auVar60);
                if ((((auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar60 >> 0x7f,0) != '\0') || SUB321(auVar60 >> 0xbf,0) != '\0') ||
                    auVar60[0x1f] < '\0') {
                  *(byte *)&ppVar30->flag = (byte)ppVar30->flag | 0x40;
                  iVar80 = 0;
                  iVar53 = 0;
                  iVar37 = 0;
                  iVar47 = 0;
                  iVar28 = 0;
                  uVar36 = 0;
                }
                ppVar30->score = iVar80;
                ppVar30->end_query = uVar36;
                ppVar30->end_ref = iVar28;
                ((ppVar30->field_4).stats)->matches = iVar53;
                ((ppVar30->field_4).stats)->similar = iVar37;
                ((ppVar30->field_4).stats)->length = iVar47;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_19);
                parasail_free(b_18);
                parasail_free(b_17);
                parasail_free(ptr);
                parasail_free(b_16);
                parasail_free(b_15);
                parasail_free(b_14);
                parasail_free(b_13);
                return ppVar30;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar44 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_scan_profile_avx2_256_64",pcVar44);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}